

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  uint uVar1;
  uint uVar2;
  LodePNGColorType LVar3;
  uint uVar4;
  uchar *puVar5;
  size_t __n;
  
  if (dest->palette != (uchar *)0x0) {
    free(dest->palette);
  }
  dest->palette = (uchar *)0x0;
  dest->palettesize = 0;
  uVar1 = source->key_b;
  dest->key_g = source->key_g;
  dest->key_b = uVar1;
  LVar3 = source->colortype;
  uVar4 = source->bitdepth;
  puVar5 = source->palette;
  uVar1 = source->key_defined;
  uVar2 = source->key_r;
  dest->palettesize = source->palettesize;
  dest->key_defined = uVar1;
  dest->key_r = uVar2;
  dest->colortype = LVar3;
  dest->bitdepth = uVar4;
  dest->palette = puVar5;
  if (source->palette != (uchar *)0x0) {
    puVar5 = (uchar *)malloc(0x400);
    dest->palette = puVar5;
    if ((puVar5 == (uchar *)0x0) && (source->palettesize != 0)) {
      return 0x53;
    }
    __n = source->palettesize << 2;
    if (__n != 0) {
      memcpy(puVar5,source->palette,__n);
    }
  }
  return 0;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source) {
  lodepng_color_mode_cleanup(dest);
  lodepng_memcpy(dest, source, sizeof(LodePNGColorMode));
  if(source->palette) {
    dest->palette = (unsigned char*)lodepng_malloc(1024);
    if(!dest->palette && source->palettesize) return 83; /*alloc fail*/
    lodepng_memcpy(dest->palette, source->palette, source->palettesize * 4);
  }
  return 0;
}